

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

fio_url_s * fio_url_parse(fio_url_s *__return_storage_ptr__,char *url,size_t length)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char *local_28;
  char *pos;
  char *end;
  size_t length_local;
  char *url_local;
  
  pcVar3 = url + length;
  memset(__return_storage_ptr__,0,0xc0);
  (__return_storage_ptr__->scheme).data = url;
  if (length == 0) goto LAB_0010e956;
  local_28 = url;
  pcVar4 = url;
  if (*url == '/') {
LAB_0010e76b:
    while( true ) {
      bVar5 = false;
      if ((local_28 < pcVar3) && (bVar5 = false, *local_28 != '#')) {
        bVar5 = *local_28 != '?';
      }
      if (!bVar5) break;
      local_28 = local_28 + 1;
    }
    (__return_storage_ptr__->path).capa = 0;
    (__return_storage_ptr__->path).len = (long)local_28 - (long)pcVar4;
    (__return_storage_ptr__->path).data = pcVar4;
    if (pcVar3 <= local_28) goto LAB_0010e956;
    pcVar4 = local_28 + 1;
    cVar1 = *local_28;
    local_28 = pcVar4;
    if (cVar1 != '#') {
LAB_0010e84b:
      while( true ) {
        bVar5 = false;
        if (local_28 < pcVar3) {
          bVar5 = *local_28 != '#';
        }
        if (!bVar5) break;
        local_28 = local_28 + 1;
      }
      (__return_storage_ptr__->query).capa = 0;
      (__return_storage_ptr__->query).len = (long)local_28 - (long)pcVar4;
      (__return_storage_ptr__->query).data = pcVar4;
      local_28 = local_28 + 1;
      if (pcVar3 <= local_28) goto LAB_0010e956;
    }
  }
  else {
    while( true ) {
      bVar5 = false;
      if ((((local_28 < pcVar3) && (bVar5 = false, *local_28 != ':')) &&
          (bVar5 = false, *local_28 != '/')) &&
         ((bVar5 = false, *local_28 != '@' && (bVar5 = false, *local_28 != '#')))) {
        bVar5 = *local_28 != '?';
      }
      if (!bVar5) break;
      local_28 = local_28 + 1;
    }
    if (local_28 == pcVar3) {
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)local_28 - (long)url;
      (__return_storage_ptr__->host).data = url;
      goto LAB_0010e956;
    }
    switch(*local_28) {
    case '#':
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)local_28 - (long)url;
      (__return_storage_ptr__->host).data = url;
      local_28 = local_28 + 1;
      goto LAB_0010e8fd;
    default:
switchD_0010df32_caseD_24:
      pcVar4 = local_28;
      while( true ) {
        bVar5 = false;
        if (((local_28 < pcVar3) && (bVar5 = false, *local_28 != ':')) &&
           (bVar5 = false, *local_28 != '/')) {
          bVar5 = *local_28 != '@';
        }
        if (!bVar5) break;
        local_28 = local_28 + 1;
      }
      if (pcVar3 <= local_28) {
        (__return_storage_ptr__->host).capa = 0;
        (__return_storage_ptr__->host).len = (long)local_28 - (long)pcVar4;
        (__return_storage_ptr__->host).data = pcVar4;
        goto LAB_0010e956;
      }
      cVar1 = *local_28;
      if (cVar1 == '/') {
        (__return_storage_ptr__->host).capa = 0;
        (__return_storage_ptr__->host).len = (long)local_28 - (long)pcVar4;
        (__return_storage_ptr__->host).data = pcVar4;
        pcVar4 = local_28;
        goto LAB_0010e76b;
      }
      if (cVar1 == ':') {
        (__return_storage_ptr__->user).capa = 0;
        (__return_storage_ptr__->user).len = (long)local_28 - (long)pcVar4;
        (__return_storage_ptr__->user).data = pcVar4;
        local_28 = local_28 + 1;
        pcVar2 = local_28;
      }
      else {
        pcVar2 = local_28;
        if (cVar1 == '@') {
          (__return_storage_ptr__->user).capa = 0;
          (__return_storage_ptr__->user).len = (long)local_28 - (long)pcVar4;
          (__return_storage_ptr__->user).data = pcVar4;
          local_28 = local_28 + 1;
          pcVar4 = local_28;
          goto LAB_0010e515;
        }
      }
      break;
    case '/':
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)local_28 - (long)url;
      (__return_storage_ptr__->host).data = url;
      pcVar4 = local_28;
      goto LAB_0010e76b;
    case ':':
      if (((local_28 + 2 <= pcVar3) && (local_28[1] == '/')) && (local_28[2] == '/')) {
        (__return_storage_ptr__->scheme).len = (long)local_28 - (long)url;
        local_28 = local_28 + 3;
        goto switchD_0010df32_caseD_24;
      }
      (__return_storage_ptr__->user).capa = 0;
      (__return_storage_ptr__->user).len = (long)local_28 - (long)url;
      (__return_storage_ptr__->user).data = url;
      local_28 = local_28 + 1;
      pcVar2 = local_28;
      break;
    case '?':
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)local_28 - (long)url;
      (__return_storage_ptr__->host).data = url;
      pcVar4 = local_28 + 1;
      local_28 = pcVar4;
      goto LAB_0010e84b;
    case '@':
      (__return_storage_ptr__->user).capa = 0;
      (__return_storage_ptr__->user).len = (long)local_28 - (long)url;
      (__return_storage_ptr__->user).data = url;
      local_28 = local_28 + 1;
      pcVar4 = local_28;
      goto LAB_0010e515;
    }
    while( true ) {
      bVar5 = false;
      if ((local_28 < pcVar3) && (bVar5 = false, *local_28 != '/')) {
        bVar5 = *local_28 != '@';
      }
      if (!bVar5) break;
      local_28 = local_28 + 1;
    }
    if (pcVar3 <= local_28) {
      (__return_storage_ptr__->port).capa = 0;
      (__return_storage_ptr__->port).len = (long)local_28 - (long)pcVar2;
      (__return_storage_ptr__->port).data = pcVar2;
      (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
      (__return_storage_ptr__->host).len = (__return_storage_ptr__->user).len;
      (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
      (__return_storage_ptr__->user).len = 0;
      goto LAB_0010e956;
    }
    if (*local_28 == '/') {
      (__return_storage_ptr__->port).capa = 0;
      (__return_storage_ptr__->port).len = (long)local_28 - (long)pcVar2;
      (__return_storage_ptr__->port).data = pcVar2;
      (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
      (__return_storage_ptr__->host).len = (__return_storage_ptr__->user).len;
      (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
      (__return_storage_ptr__->user).len = 0;
      pcVar4 = local_28;
      goto LAB_0010e76b;
    }
    pcVar4 = local_28;
    if (*local_28 == '@') {
      (__return_storage_ptr__->password).capa = 0;
      (__return_storage_ptr__->password).len = (long)local_28 - (long)pcVar2;
      (__return_storage_ptr__->password).data = pcVar2;
      local_28 = local_28 + 1;
      pcVar4 = local_28;
    }
LAB_0010e515:
    while( true ) {
      bVar5 = false;
      if (((local_28 < pcVar3) && (bVar5 = false, *local_28 != '/')) &&
         ((bVar5 = false, *local_28 != ':' && (bVar5 = false, *local_28 != '#')))) {
        bVar5 = *local_28 != '?';
      }
      if (!bVar5) break;
      local_28 = local_28 + 1;
    }
    (__return_storage_ptr__->host).capa = 0;
    (__return_storage_ptr__->host).len = (long)local_28 - (long)pcVar4;
    (__return_storage_ptr__->host).data = pcVar4;
    if (pcVar3 <= local_28) goto LAB_0010e956;
    cVar1 = *local_28;
    if (cVar1 != '#') {
      pcVar4 = local_28;
      if (cVar1 == '/') goto LAB_0010e76b;
      if (cVar1 == '?') {
        pcVar4 = local_28 + 1;
        local_28 = pcVar4;
      }
      else {
        pcVar4 = local_28 + 1;
        local_28 = pcVar4;
        while( true ) {
          bVar5 = false;
          if (((local_28 < pcVar3) && (bVar5 = false, *local_28 != '/')) &&
             (bVar5 = false, *local_28 != '#')) {
            bVar5 = *local_28 != '?';
          }
          if (!bVar5) break;
          local_28 = local_28 + 1;
        }
        (__return_storage_ptr__->port).capa = 0;
        (__return_storage_ptr__->port).len = (long)local_28 - (long)pcVar4;
        (__return_storage_ptr__->port).data = pcVar4;
        if (pcVar3 <= local_28) goto LAB_0010e956;
        if (*local_28 == '#') {
          local_28 = local_28 + 1;
          goto LAB_0010e8fd;
        }
        pcVar4 = local_28;
        if (*local_28 != '?') goto LAB_0010e76b;
        pcVar4 = local_28 + 1;
        local_28 = pcVar4;
      }
      goto LAB_0010e84b;
    }
    local_28 = local_28 + 1;
  }
LAB_0010e8fd:
  (__return_storage_ptr__->target).capa = 0;
  (__return_storage_ptr__->target).len = (long)pcVar3 - (long)local_28;
  (__return_storage_ptr__->target).data = local_28;
LAB_0010e956:
  if ((__return_storage_ptr__->scheme).len == 0) {
    (__return_storage_ptr__->scheme).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->user).len == 0) {
    (__return_storage_ptr__->user).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->password).len == 0) {
    (__return_storage_ptr__->password).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->host).len == 0) {
    (__return_storage_ptr__->host).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->port).len == 0) {
    (__return_storage_ptr__->port).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->path).len == 0) {
    (__return_storage_ptr__->path).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->query).len == 0) {
    (__return_storage_ptr__->query).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->target).len == 0) {
    (__return_storage_ptr__->target).data = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

fio_url_s fio_url_parse(const char *url, size_t length) {
  /*
  Intention:
  [schema://][user[:]][password[@]][host.com[:/]][:port/][/path][?quary][#target]
  */
  const char *end = url + length;
  const char *pos = url;
  fio_url_s r = {.scheme = {.data = (char *)url}};
  if (length == 0) {
    goto finish;
  }

  if (pos[0] == '/') {
    /* start at path */
    goto start_path;
  }

  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@' &&
         pos[0] != '#' && pos[0] != '?')
    ++pos;

  if (pos == end) {
    /* was only host (path starts with '/') */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }
  switch (pos[0]) {
  case '@':
    /* username@[host] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case '/':
    /* host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '?':
    /* host?[query] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_query;
  case '#':
    /* host#[target] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_target;
  case ':':
    if (pos + 2 <= end && pos[1] == '/' && pos[2] == '/') {
      /* scheme:// */
      r.scheme.len = pos - url;
      pos += 3;
    } else {
      /* username:[password] OR */
      /* host:[port] */
      r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
      ++pos;
      goto start_password;
    }
    break;
  }

  // start_username:
  url = pos;
  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@'
         /* && pos[0] != '#' && pos[0] != '?' */)
    ++pos;

  if (pos >= end) { /* scheme://host */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }

  switch (pos[0]) {
  case '/':
    /* scheme://host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '@':
    /* scheme://username@[host]... */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case ':':
    /* scheme://username:[password]@[host]... OR */
    /* scheme://host:[port][/...] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_password:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '@')
    ++pos;

  if (pos >= end) {
    /* was host:port */
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto finish;
    ;
  }

  switch (pos[0]) {
  case '/':
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto start_path;
  case '@':
    r.password = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_host:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != ':' && pos[0] != '#' &&
         pos[0] != '?')
    ++pos;

  r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  if (pos >= end) {
    goto finish;
  }
  switch (pos[0]) {
  case '/':
    /* scheme://[...@]host[/path] */
    goto start_path;
  case '?':
    /* scheme://[...@]host?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host#[target] (bad)*/
    ++pos;
    goto start_target;
    // case ':':
    /* scheme://[...@]host:[port] */
  }
  ++pos;

  // start_port:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    /* scheme://[...@]host:port */
    goto finish;
  }
  switch (pos[0]) {
  case '?':
    /* scheme://[...@]host:port?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host:port#[target] (bad)*/
    ++pos;
    goto start_target;
    // case '/':
    /* scheme://[...@]host:port[/path] */
  }

start_path:
  url = pos;
  while (pos < end && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.path = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    goto finish;
  }
  ++pos;
  if (pos[-1] == '#')
    goto start_target;

start_query:
  url = pos;
  while (pos < end && pos[0] != '#')
    ++pos;

  r.query = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  ++pos;

  if (pos >= end)
    goto finish;

start_target:
  r.target = (fio_str_info_s){.data = (char *)pos, .len = end - pos};

finish:

  /* set any empty values to NULL */
  if (!r.scheme.len)
    r.scheme.data = NULL;
  if (!r.user.len)
    r.user.data = NULL;
  if (!r.password.len)
    r.password.data = NULL;
  if (!r.host.len)
    r.host.data = NULL;
  if (!r.port.len)
    r.port.data = NULL;
  if (!r.path.len)
    r.path.data = NULL;
  if (!r.query.len)
    r.query.data = NULL;
  if (!r.target.len)
    r.target.data = NULL;

  return r;
}